

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O0

void show_http_content(char *p,size_t l)

{
  int iVar1;
  undefined8 local_18;
  size_t l_local;
  char *p_local;
  
  iVar1 = lwsl_visible(8);
  local_18 = l;
  l_local = (size_t)p;
  if (iVar1 != 0) {
    while (local_18 != 0) {
      if (*(char *)l_local < '\x7f') {
        putchar((int)*(char *)l_local);
        local_18 = local_18 - 1;
        l_local = l_local + 1;
      }
      else {
        putchar(0x2e);
        local_18 = local_18 - 1;
      }
    }
  }
  return;
}

Assistant:

static void show_http_content(const char *p, size_t l)
{
	if (lwsl_visible(LLL_INFO)) {
		while (l--)
			if (*p < 0x7f)
				putchar(*p++);
			else
				putchar('.');
	}
}